

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
::table_core(table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *this,size_t n,hash<std::pair<unsigned_int,_unsigned_int>,_void> *h_,
            equal_to<std::pair<unsigned_int,_unsigned_int>_> *pred_,
            allocator<std::pair<unsigned_int,_unsigned_int>_> *al_)

{
  size_t sVar1;
  
  new_arrays(&this->arrays,this,n);
  sVar1 = initial_max_load(this);
  (this->size_ctrl).ml = sVar1;
  (this->size_ctrl).size = 0;
  return;
}

Assistant:

table_core(std::size_t n = default_bucket_count, const Hash& h_ = Hash(),
               const Pred& pred_ = Pred(), const Allocator& al_ = Allocator()) :
        hash_base{empty_init, h_}, pred_base{empty_init, pred_}, allocator_base{empty_init, al_},
        arrays(new_arrays(n)), size_ctrl{initial_max_load(), 0} {}